

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# offline-ekf-flexibility-estimation.hxx
# Opt level: O2

IndexedMatrixArray *
stateObservation::examples::offlineEKFFlexibilityEstimation
          (IndexedMatrixArray *y,Matrix *xh0,uint numberOfContacts,
          vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          *contactsPositions,double dt)

{
  uint uVar1;
  uint uVar2;
  IndexedMatrixArray *in_R8;
  void *local_b8 [3];
  IndexedMatrixArray u;
  deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_98 [80];
  ConstantReturnType local_48;
  
  stateObservation::IndexedMatrixArray::IndexedMatrixArray(&u);
  uVar1 = IndexedMatrixArray::getFirstIndex((IndexedMatrixArray *)xh0);
  uVar1 = uVar1 - 1;
  while( true ) {
    uVar2 = IndexedMatrixArray::getLastIndex((IndexedMatrixArray *)xh0);
    if (uVar2 < uVar1) break;
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero(&local_48,0xf,1);
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_b8,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)&local_48);
    IndexedMatrixArray::setValue(&u,(Matrix *)local_b8,uVar1);
    free(local_b8[0]);
    uVar1 = uVar1 + 1;
  }
  offlineEKFFlexibilityEstimation
            (y,(IndexedMatrixArray *)xh0,(Matrix *)&u,numberOfContacts,
             (vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)((ulong)contactsPositions & 0xffffffff),0.0,in_R8,(IndexedMatrixArray *)0x0);
  std::
  deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::~deque(local_98);
  return y;
}

Assistant:

stateObservation::IndexedMatrixArray offlineEKFFlexibilityEstimation(
            const stateObservation::IndexedMatrixArray & y,
            const Matrix & xh0,
            unsigned numberOfContacts,
            const std::vector<Vector3, Eigen::aligned_allocator<Vector3> > & contactsPositions,
            double dt)
{
    const unsigned inputSize=15;

    ///initialization of a zero input
    stateObservation::IndexedMatrixArray u;
    for (unsigned k=y.getFirstIndex()-1; k<=y.getLastIndex(); ++k)
    {
        u.setValue(Vector::Zero(inputSize,1),k);
    }

    return offlineEKFFlexibilityEstimation
                        (y, u, xh0, numberOfContacts, contactsPositions, dt);
}